

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O0

void Js::SparseArraySegmentBase::EnsureSizeInBound
               (uint32 left,uint32 length,uint32 *size,SparseArraySegmentBase *next)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint *puVar4;
  uint local_2c;
  uint local_28;
  uint local_24;
  SparseArraySegmentBase *pSStack_20;
  uint32 nextLeft;
  SparseArraySegmentBase *next_local;
  uint32 *size_local;
  uint32 length_local;
  uint32 left_local;
  
  if (next == (SparseArraySegmentBase *)0x0) {
    local_2c = 0xffffffff;
  }
  else {
    local_2c = next->left;
  }
  local_24 = local_2c;
  pSStack_20 = next;
  next_local = (SparseArraySegmentBase *)size;
  size_local._0_4_ = length;
  size_local._4_4_ = left;
  if (local_2c <= left) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                ,0x19,"(nextLeft > left)","nextLeft > left");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (next_local->left != 0) {
    local_28 = local_24 - size_local._4_4_;
    puVar4 = min<unsigned_int>(&next_local->left,&local_28);
    next_local->left = *puVar4;
  }
  if (next_local->left < (uint32)size_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                ,0x21,"(length <= size)","length <= size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void SparseArraySegmentBase::EnsureSizeInBound(uint32 left, uint32 length, uint32& size, SparseArraySegmentBase* next)
    {
        uint32 nextLeft = next ? next->left : JavascriptArray::MaxArrayLength;
        Assert(nextLeft > left);

        if(size != 0)
        {
            // Avoid writing to 'size' for an empty segment. The empty segment is a constant structure and writing to it (even
            // if it's not being changed) may cause an AV.
            size = min(size, nextLeft - left);
        }
        AssertOrFailFast(length <= size);
    }